

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matcher.hpp
# Opt level: O3

bool __thiscall
Kernel::MatchingUtils::
matchTerms<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal*>>::GenMatcher::Binder>
          (MatchingUtils *this,TermList base,TermList instance,Binder *binder)

{
  bool bVar1;
  int iVar2;
  Binder *binder_00;
  int iVar3;
  MatchingUtils *pMVar4;
  
  if (((ulong)this & 3) != 0) {
    iVar2 = Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal_*>_>::GenMatcher::
            Binder::bind((Binder *)instance._content,(int)((ulong)this >> 2),
                         (sockaddr *)base._content,(socklen_t)binder);
    return SUB41(iVar2,0);
  }
  if (((base._content & 3) != 0) ||
     (binder_00 = (Binder *)(ulong)*(uint *)(this + 8),
     *(uint *)(this + 8) != *(uint *)(base._content + 8))) {
    return false;
  }
  if ((((byte)this[0x28] & 8) != 0) && ((*(byte *)(base._content + 0x28) & 8) != 0)) {
    pMVar4 = this;
    if (*(int *)(this + 0xc) < 0) {
      iVar2 = 0;
      do {
        pMVar4 = *(MatchingUtils **)(pMVar4 + 0x20);
        if (((ulong)pMVar4 & 1) != 0) {
          iVar3 = 3;
          goto LAB_003e6606;
        }
        iVar2 = iVar2 + 2;
      } while (*(int *)(pMVar4 + 0xc) < 0);
    }
    else {
      iVar2 = 0;
    }
    iVar3 = *(int *)(pMVar4 + 0x20);
LAB_003e6606:
    if (iVar2 + iVar3 == 0) {
      return this == (MatchingUtils *)base._content;
    }
    binder_00 = (Binder *)(ulong)*(uint *)(this + 0x10);
    if (*(uint *)(base._content + 0x10) < *(uint *)(this + 0x10)) {
      return false;
    }
  }
  bVar1 = matchArgs<Indexing::SubstitutionTree<Indexing::TermWithValue<Kernel::Literal*>>::GenMatcher::Binder>
                    (this,(Term *)base._content,(Term *)instance._content,binder_00);
  return bVar1;
}

Assistant:

static bool matchTerms(TermList base, TermList instance, Binder& binder)
  {
    if(base.isTerm()) {
      Term* bt=base.term();
      if(!instance.isTerm() || base.term()->functor()!=instance.term()->functor()) {
        return false;
      }
      Term* it=instance.term();
      if(bt->shared() && it->shared()) {
        if(bt->ground()) {
          return bt==it;
        }
        if(bt->weight() > it->weight()) {
          return false;
        }
      }
      ASS_G(base.term()->arity(),0);
      return matchArgs(base.term(), instance.term(), binder);
    } else {
      ASS(base.isOrdinaryVar());
      return binder.bind(base.var(), instance);
    }
  }